

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::VariableDimensionSyntax::setChild
          (VariableDimensionSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined1 uVar1;
  NumericTokenFlags NVar2;
  uint32_t uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar6;
  long lVar7;
  
  if (index == 2) {
    pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar1 = pvVar5->field_0x2;
    NVar2.raw = (pvVar5->numFlags).raw;
    uVar3 = pvVar5->rawLen;
    pSVar6 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)pvVar5->info;
    (this->closeBracket).kind = pvVar5->kind;
    (this->closeBracket).field_0x2 = uVar1;
    (this->closeBracket).numFlags = (NumericTokenFlags)NVar2.raw;
    (this->closeBracket).rawLen = uVar3;
    lVar7 = 0x38;
  }
  else if (index == 1) {
    ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    lVar7 = 0x28;
    if (*ppSVar4 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar6 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar6 = *ppSVar4;
    }
  }
  else {
    pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar1 = pvVar5->field_0x2;
    NVar2.raw = (pvVar5->numFlags).raw;
    uVar3 = pvVar5->rawLen;
    pSVar6 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)pvVar5->info;
    (this->openBracket).kind = pvVar5->kind;
    (this->openBracket).field_0x2 = uVar1;
    (this->openBracket).numFlags = (NumericTokenFlags)NVar2.raw;
    (this->openBracket).rawLen = uVar3;
    lVar7 = 0x20;
  }
  *(variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *)
   ((long)&(this->super_SyntaxNode).kind + lVar7) = pSVar6;
  return;
}

Assistant:

void VariableDimensionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBracket = child.token(); return;
        case 1: specifier = child.node() ? &child.node()->as<DimensionSpecifierSyntax>() : nullptr; return;
        case 2: closeBracket = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}